

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElasticityReissnerOrthotropic::ChElasticityReissnerOrthotropic
          (ChElasticityReissnerOrthotropic *this,double m_E_x,double m_E_y,double m_nu_xy,
          double m_G_xy,double m_G_xz,double m_G_yz,double m_alpha,double m_beta)

{
  (this->super_ChElasticityReissner).section = (ChMaterialShellReissner *)0x0;
  (this->super_ChElasticityReissner)._vptr_ChElasticityReissner =
       (_func_int **)&PTR__ChElasticityReissner_011777a0;
  this->E_x = m_E_x;
  this->E_y = m_E_y;
  this->nu_xy = m_nu_xy;
  this->G_xy = m_G_xy;
  this->G_xz = m_G_xz;
  this->G_yz = m_G_yz;
  this->alpha = m_alpha;
  this->beta = m_beta;
  return;
}

Assistant:

ChElasticityReissnerOrthotropic::ChElasticityReissnerOrthotropic(      double m_E_x,
                                                                       double m_E_y,
                                                                       double m_nu_xy,
                                                                       double m_G_xy,
                                                                       double m_G_xz,
                                                                       double m_G_yz,
                                                                       double m_alpha,
                                                                       double m_beta) {
    E_x = m_E_x;
    E_y = m_E_y;
    nu_xy = m_nu_xy;
    G_xy = m_G_xy;
    G_xz = m_G_xz;
    G_yz = m_G_yz;
    alpha = m_alpha;
    beta = m_beta;
}